

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmStateSnapshot *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  string *psVar5;
  long lVar6;
  bool bVar7;
  bool *pbVar8;
  bool bVar9;
  string lang;
  string objectName;
  string repVar;
  string relFromBinary;
  string relFromSource;
  string local_108;
  cmLocalGenerator *local_e8;
  cmSourceFile *local_e0;
  char *local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  string local_a0;
  string local_80;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_e0 = source;
  local_d8 = customOutputExtension;
  local_c0._24_8_ = hasSourceExtension;
  local_58 = dir_max;
  psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  this_00 = &this->StateSnapshot;
  local_e8 = this;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d0,this_00);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_d0);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d0,this_00);
  cmStateDirectory::ConvertToRelPathIfNotContained
            (&local_50,(cmStateDirectory *)local_d0,psVar5,psVar4);
  if (local_50._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa1e,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_50);
  local_60 = __return_storage_ptr__;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d0,this_00);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_d0);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d0,this_00);
  cmStateDirectory::ConvertToRelPathIfNotContained
            (&local_80,(cmStateDirectory *)local_d0,psVar5,psVar4);
  if (local_80._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa25,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_80);
  local_d0._8_8_ = 0;
  local_c0[0] = '\0';
  local_d0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c0;
  std::__cxx11::string::_M_assign((string *)local_d0);
  bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_d0);
  if ((bVar3) && (bVar3 = cmake::GetIsInTryCompile(local_e8->GlobalGenerator->CMakeInstance), bVar3)
     ) {
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(local_e0);
    cmsys::SystemTools::GetFilenameName(&local_108,psVar4);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"KEEP_EXTENSION","");
  bVar3 = cmSourceFile::GetPropertyAsBool(local_e0,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pbVar8 = (bool *)local_c0._24_8_;
  bVar7 = true;
  if (bVar3) goto LAB_0021aaa1;
  bVar3 = NeedBackwardsCompatibility_2_4(local_e8);
  if (bVar3) {
    bVar9 = local_d8 != (char *)0x0;
LAB_0021a9f5:
    lVar6 = std::__cxx11::string::rfind((char)local_d0,0x2e);
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)&local_108,(ulong)local_d0);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar9) {
      std::__cxx11::string::append(local_d0);
      bVar7 = false;
      goto LAB_0021aaa1;
    }
    bVar7 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_108,local_e0);
    if (local_108._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x20),"CMAKE_","");
      std::__cxx11::string::_M_append(local_c0 + 0x20,(ulong)local_108._M_dataplus._M_p);
      std::__cxx11::string::append(local_c0 + 0x20);
      bVar3 = cmMakefile::IsOn(local_e8->Makefile,(string *)(local_c0 + 0x20));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar9 = local_d8 != (char *)0x0;
    bVar7 = true;
    pbVar8 = (bool *)local_c0._24_8_;
    if ((bVar3 | bVar9) == 1) goto LAB_0021a9f5;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            (&local_108,local_e8->GlobalGenerator,local_e0);
  std::__cxx11::string::_M_append(local_d0,(ulong)local_108._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_0021aaa1:
  if (pbVar8 != (bool *)0x0) {
    *pbVar8 = bVar7;
  }
  psVar5 = CreateSafeUniqueObjectFileName(local_e8,(string *)local_d0,local_58);
  psVar4 = local_60;
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + psVar5->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d0._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c0) {
    operator_delete((void *)local_d0._0_8_,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = this->MaybeConvertToRelativePath(
    this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = this->MaybeConvertToRelativePath(
    this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}